

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall HEkk::initialiseSimplexLpRandomVectors(HEkk *this)

{
  HighsRandom *this_00;
  uint N;
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  vector<double,_std::allocator<double>_> *this_01;
  HighsInt i;
  int N_00;
  size_type __new_size;
  double dVar4;
  
  N = (this->lp_).num_col_;
  __new_size = (long)(this->lp_).num_row_ + (long)(int)N;
  N_00 = (int)__new_size;
  if (N_00 != 0) {
    this_00 = &this->random_;
    if (N != 0) {
      std::vector<int,_std::allocator<int>_>::resize(&(this->info_).numColPermutation_,(long)(int)N)
      ;
      piVar1 = (this->info_).numColPermutation_.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = 0;
      uVar3 = 0;
      if (0 < (int)N) {
        uVar3 = (ulong)N;
      }
      for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        piVar1[uVar2] = (int)uVar2;
      }
      HighsRandom::shuffle<int>(this_00,piVar1,N);
    }
    std::vector<int,_std::allocator<int>_>::resize(&(this->info_).numTotPermutation_,__new_size);
    piVar1 = (this->info_).numTotPermutation_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = 0;
    uVar3 = 0;
    if (0 < N_00) {
      uVar3 = __new_size & 0xffffffff;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      piVar1[uVar2] = (int)uVar2;
    }
    HighsRandom::shuffle<int>(this_00,piVar1,N_00);
    this_01 = &(this->info_).numTotRandomValue_;
    std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size);
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      dVar4 = HighsRandom::fraction(this_00);
      (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_start[uVar2] = dVar4;
    }
  }
  return;
}

Assistant:

void HEkk::initialiseSimplexLpRandomVectors() {
  const HighsInt num_col = lp_.num_col_;
  const HighsInt num_tot = lp_.num_col_ + lp_.num_row_;
  if (!num_tot) return;
  // Instantiate and (re-)initialise the random number generator
  //  HighsRandom random;
  HighsRandom& random = random_;
  //  random.initialise();

  if (num_col) {
    // Generate a random permutation of the column indices
    vector<HighsInt>& numColPermutation = info_.numColPermutation_;
    numColPermutation.resize(num_col);
    for (HighsInt i = 0; i < num_col; i++) numColPermutation[i] = i;
    random.shuffle(numColPermutation.data(), num_col);
  }

  // Re-initialise the random number generator and generate the
  // random vectors in the same order as hsol to maintain repeatable
  // performance
  // random.initialise();

  // Generate a random permutation of all the indices
  vector<HighsInt>& numTotPermutation = info_.numTotPermutation_;
  numTotPermutation.resize(num_tot);
  for (HighsInt i = 0; i < num_tot; i++) numTotPermutation[i] = i;
  random.shuffle(numTotPermutation.data(), num_tot);

  // Generate a vector of random reals
  info_.numTotRandomValue_.resize(num_tot);
  vector<double>& numTotRandomValue = info_.numTotRandomValue_;
  for (HighsInt i = 0; i < num_tot; i++) {
    numTotRandomValue[i] = random.fraction();
  }
}